

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_thread.hpp
# Opt level: O0

thread_priority oqpi::posix_thread::get_priority(native_handle_type handle)

{
  FILE *__stream;
  int iVar1;
  int iVar2;
  int iVar3;
  native_handle_type nVar4;
  float prioFrac;
  int error;
  int policy;
  sched_param posixPriority;
  thread_priority threadPriority;
  native_handle_type handle_local;
  
  policy = 2;
  _posixPriority = handle;
  memset(&error,0,4);
  prioFrac = 2.8026e-45;
  iVar1 = pthread_getschedparam(_posixPriority,(int *)&prioFrac,(sched_param *)&error);
  __stream = _stderr;
  if (iVar1 == 0) {
    iVar1 = get_min_priority();
    iVar2 = get_max_priority();
    iVar3 = get_min_priority();
    policy = (int)(((float)(error - iVar1) / (float)(iVar2 - iVar3)) * 5.0);
  }
  else {
    nVar4 = get_current_thread_id();
    fprintf(__stream,"[warning] Unable to retrieve thread priority for thread %lu\n",nVar4);
  }
  return policy;
}

Assistant:

static thread_priority get_priority(native_handle_type handle)
        {
            auto threadPriority = thread_priority::normal;
            auto posixPriority  = sched_param{};
            auto policy         = POSIX_SCHED_POLICY;
            const auto error    = pthread_getschedparam(handle, &policy, &posixPriority);

            if(error == 0)
            {
                const auto prioFrac = (posixPriority.sched_priority - get_min_priority()) / (float)(get_max_priority() - get_min_priority());
                threadPriority      = static_cast<thread_priority>(prioFrac * ((uint32_t) thread_priority::count - 1));
            }
            else
            {
                oqpi_warning("Unable to retrieve thread priority for thread %lu", get_current_thread_id());
            }

            return threadPriority;
        }